

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

iterator * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
          (iterator *this)

{
  array<std::byte,_8UL> search_key;
  bool bVar1;
  bool bVar2;
  _Elt_pointer psVar3;
  ulong uVar4;
  iterator *unaff_R12;
  iterator *piVar5;
  bool local_29 [8];
  bool match;
  
  psVar3 = (this->stack_).c.
           super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 == (this->stack_).c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar4 = 0;
  }
  else {
    if (psVar3 == (this->stack_).c.
                  super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar3 = (this->stack_).c.
               super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    uVar4 = psVar3[-1].super_iter_result.node.tagged_ptr;
  }
  piVar5 = this;
  if (uVar4 != 0) {
    if ((uVar4 & 7) != 0) {
      __assert_fail("node.type() == node_type::LEAF",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x88c,
                    "typename olc_db<Key, Value>::iterator &unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    search_key._M_elems =
         *&(((anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 *)(uVar4 + 0x20))->
           key_bytes)._M_elems;
    bVar1 = try_prior(this);
    if (!bVar1) {
      do {
        local_29[0] = false;
        bVar2 = try_seek(this,(art_key_type)search_key._M_elems,local_29,false);
        bVar1 = true;
        if (bVar2) {
          if (local_29[0] == true) {
            bVar2 = try_prior(this);
            bVar1 = !bVar2;
            if (bVar2) {
              unaff_R12 = this;
            }
          }
          else {
            bVar1 = false;
            unaff_R12 = this;
          }
        }
        piVar5 = unaff_R12;
      } while (bVar1);
    }
  }
  return piVar5;
}

Assistant:

typename olc_db<Key, Value>::iterator& olc_db<Key, Value>::iterator::prior() {
  const auto node = current_node();
  if (node != nullptr) {
    UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
    const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf
    // TODO(thompsonbry) : variable length keys: We need a temporary
    // copy of the key since actions on the stack will make it
    // impossible to reconstruct the key.  So maybe we have two
    // internal buffers on the iterator to support this?
    const auto& akey = leaf->get_key();  // access the key on the leaf.
    if (UNODB_DETAIL_LIKELY(try_prior())) return *this;
    while (true) {
      bool match{};
      // seek to the current key (or its predecessor)
      if (!try_seek(akey, match, false /*fwd*/)) continue;
      if (!match) {
        // The key no longer exists, so its predecessor is the prior
        // leaf and we are done.
        return *this;
      }
      if (!try_prior()) continue;  // seek to the predecessor
      return *this;                // done.
    }
  }
  return *this;  // LCOV_EXCL_LINE
}